

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall
SVGChart::PPlot::DrawYTick
          (PPlot *this,float inY,int inScreenX,bool inMajor,string *inFormatString,
          Painter *inPainter,PRect *outRect)

{
  int iVar1;
  int extraout_var;
  undefined7 in_register_00000011;
  int iVar2;
  float extraout_XMM0_Da;
  char theBuf [128];
  char local_b8 [136];
  
  (*this->mYTrafo->_vptr_Trafo[2])();
  outRect->mX = (long)inScreenX;
  outRect->mY = (long)extraout_XMM0_Da;
  outRect->mW = 0;
  outRect->mH = 0;
  if ((int)CONCAT71(in_register_00000011,inMajor) == 0) {
    iVar2 = (this->mYAxisSetup).mTickInfo.mMinorTickScreenSize;
    outRect->mX = (long)inScreenX - (long)iVar2;
  }
  else {
    iVar2 = (this->mYAxisSetup).mTickInfo.mMajorTickScreenSize;
    snprintf(local_b8,0x80,(inFormatString->_M_dataplus)._M_p,SUB84((double)inY,0));
    iVar1 = (*inPainter->_vptr_Painter[8])(inPainter,local_b8);
    outRect->mX = outRect->mX -
                  ((long)(iVar1 + iVar2) + (long)(this->mYAxisSetup).mTickInfo.mMinorTickScreenSize)
    ;
    iVar1 = (*inPainter->_vptr_Painter[9])(inPainter);
    (*inPainter->_vptr_Painter[10])
              (inPainter,(ulong)(uint)outRect->mX,
               (ulong)(uint)(int)(extraout_XMM0_Da +
                                 (float)(int)((ulong)(CONCAT44(extraout_var,iVar1) -
                                                     ((long)extraout_var >> 0x1f)) >> 1)),local_b8);
  }
  (**inPainter->_vptr_Painter)
            ((float)inScreenX,extraout_XMM0_Da,(float)(inScreenX - iVar2),extraout_XMM0_Da,inPainter
            );
  return true;
}

Assistant:

bool PPlot::DrawYTick (float inY, int inScreenX, bool inMajor, const string &inFormatString, Painter &inPainter, PRect &outRect) const {
      char theBuf[128];
      int theTickSize;
      float theScreenY = mYTrafo->Transform(inY);
      outRect.mX = inScreenX;
      outRect.mY = theScreenY;
      outRect.mW = 0;// not used
      outRect.mH = 0;// not used
      if (inMajor) {
        theTickSize = mYAxisSetup.mTickInfo.mMajorTickScreenSize;
        snprintf (theBuf, 128, inFormatString.c_str (), inY);
        int theStringWidth = inPainter.CalculateTextDrawSize (theBuf);
        outRect.mX -= (theStringWidth+theTickSize+mYAxisSetup.mTickInfo.mMinorTickScreenSize);
        int theHalfFontHeight = inPainter.GetFontHeight ()/2;// for sort of vertical centralizing
        inPainter.DrawText (outRect.mX, theScreenY+theHalfFontHeight, theBuf);

      }
      else {
        theTickSize = mYAxisSetup.mTickInfo.mMinorTickScreenSize;
        outRect.mX -= theTickSize;
      }

      inPainter.DrawLine (inScreenX, theScreenY, inScreenX-theTickSize, theScreenY);
      return true;
    }